

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message.h
# Opt level: O2

size_t __thiscall
std::hash<bidfx_public_api::price::pixie::AckMessage>::operator()
          (hash<bidfx_public_api::price::pixie::AckMessage> *this,AckMessage *message)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = bidfx_public_api::price::pixie::AckMessage::GetRevision();
  uVar2 = bidfx_public_api::price::pixie::AckMessage::GetAckTime();
  uVar3 = bidfx_public_api::price::pixie::AckMessage::GethandlingDurationMicros();
  uVar4 = bidfx_public_api::price::pixie::AckMessage::GetPriceReceivedTime();
  uVar5 = bidfx_public_api::price::pixie::AckMessage::GetRevisionTime();
  return uVar5 ^ uVar4 ^ uVar3 ^ uVar2 ^ uVar1;
}

Assistant:

std::size_t operator()(const AckMessage &message) const {
        return std::hash<long>()(message.GetRevision()) ^
               std::hash<long>()(message.GetAckTime()) ^
               std::hash<long>()(message.GethandlingDurationMicros()) ^
               std::hash<long>()(message.GetPriceReceivedTime()) ^
               std::hash<long>()(message.GetRevisionTime());
    }